

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O3

Vec_Ptr_t * Abc_AigDfsMap(Abc_Ntk_t *pNtk)

{
  int iVar1;
  undefined4 uVar2;
  uint uVar3;
  long *plVar4;
  long lVar5;
  void *pvVar6;
  int *__s;
  Vec_Ptr_t *vNodes;
  void **ppvVar7;
  Vec_Ptr_t *pVVar8;
  ulong uVar9;
  int Fill;
  int Fill_00;
  int iVar10;
  long lVar11;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                  ,0x4db,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar1 = pNtk->vObjs->nSize;
    uVar9 = (long)iVar1 + 500;
    iVar10 = (int)uVar9;
    if ((pNtk->vTravIds).nCap < iVar10) {
      __s = (int *)malloc(uVar9 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar10;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar1) {
      memset(__s,0,(uVar9 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar10;
  }
  iVar1 = pNtk->nTravIds;
  pNtk->nTravIds = iVar1 + 1;
  if (0x3ffffffe < iVar1) {
    __assert_fail("p->nTravIds < (1<<30)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                  ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
  }
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar7 = (void **)malloc(800);
  vNodes->pArray = ppvVar7;
  pVVar8 = pNtk->vCos;
  uVar9 = (ulong)(uint)pVVar8->nSize;
  if (0 < pVVar8->nSize) {
    lVar11 = 0;
    do {
      if ((long)(int)uVar9 - (long)pNtk->nBarBufs <= lVar11) {
        plVar4 = (long *)pVVar8->pArray[lVar11];
        Abc_AigDfs_rec(*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8),
                       vNodes);
        lVar5 = *plVar4;
        iVar1 = (int)plVar4[2];
        uVar2 = *(undefined4 *)(lVar5 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar1 + 1,Fill);
        if (((long)iVar1 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar1)) goto LAB_0085a18a;
        *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar1 * 4) = uVar2;
        pvVar6 = *(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[6] * 8);
        if ((*(uint *)((long)pvVar6 + 0x14) & 0xf) != 8) {
          __assert_fail("Abc_ObjIsLatch(Abc_ObjFanout0(pNode))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x4e8,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
        }
        uVar3 = vNodes->nSize;
        if (uVar3 == vNodes->nCap) {
          if ((int)uVar3 < 0x10) {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc(0x80);
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,0x80);
            }
            vNodes->pArray = ppvVar7;
            vNodes->nCap = 0x10;
          }
          else {
            if (vNodes->pArray == (void **)0x0) {
              ppvVar7 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar7 = (void **)realloc(vNodes->pArray,(ulong)uVar3 << 4);
            }
            vNodes->pArray = ppvVar7;
            vNodes->nCap = uVar3 * 2;
          }
        }
        else {
          ppvVar7 = vNodes->pArray;
        }
        iVar1 = vNodes->nSize;
        vNodes->nSize = iVar1 + 1;
        ppvVar7[iVar1] = pvVar6;
        pVVar8 = pNtk->vCos;
      }
      lVar11 = lVar11 + 1;
      uVar9 = (ulong)pVVar8->nSize;
    } while (lVar11 < (long)uVar9);
    if (0 < pVVar8->nSize) {
      lVar11 = 0;
      do {
        if ((long)(int)uVar9 - (long)pNtk->nBarBufs <= lVar11) {
          return vNodes;
        }
        plVar4 = (long *)pVVar8->pArray[lVar11];
        Abc_AigDfs_rec(*(Abc_Obj_t **)
                        (*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8),
                       vNodes);
        if ((*(uint *)((long)plVar4 + 0x14) & 0xf) - 5 < 0xfffffffe) {
          __assert_fail("Abc_ObjIsCo(pNode)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                        ,0x4f1,"Vec_Ptr_t *Abc_AigDfsMap(Abc_Ntk_t *)");
        }
        lVar5 = *plVar4;
        iVar1 = (int)plVar4[2];
        uVar2 = *(undefined4 *)(lVar5 + 0xd8);
        Vec_IntFillExtra((Vec_Int_t *)(lVar5 + 0xe0),iVar1 + 1,Fill_00);
        if (((long)iVar1 < 0) || (*(int *)(lVar5 + 0xe4) <= iVar1)) {
LAB_0085a18a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        *(undefined4 *)(*(long *)(lVar5 + 0xe8) + (long)iVar1 * 4) = uVar2;
        lVar11 = lVar11 + 1;
        pVVar8 = pNtk->vCos;
        uVar9 = (ulong)pVVar8->nSize;
      } while (lVar11 < (long)uVar9);
    }
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Abc_AigDfsMap( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    assert( Abc_NtkIsStrash(pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // collect cones of barbufs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i < Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            continue;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        Abc_NodeSetTravIdCurrent( pNode );
        // collect latch as a placeholder
        assert( Abc_ObjIsLatch(Abc_ObjFanout0(pNode)) );
        Vec_PtrPush( vNodes, Abc_ObjFanout0(pNode) );
    }
    // collect nodes of real POs
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        if ( i >= Abc_NtkCoNum(pNtk) - pNtk->nBarBufs )
            break;
        Abc_AigDfs_rec( Abc_ObjFanin0(pNode), vNodes );
        assert( Abc_ObjIsCo(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
    }
    return vNodes;
}